

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O3

qint64 __thiscall QBuffer::writeData(QBuffer *this,char *data,qint64 len)

{
  QObjectData *pQVar1;
  CompatPropertySafePoint *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  HANDLE size;
  HANDLE alloc;
  QBindingStatus *this_00;
  long in_FS_OFFSET;
  void *local_58;
  char *pcStack_50;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar3 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])();
  size = (HANDLE)(CONCAT44(extraout_var,iVar3) + len);
  this_00 = pQVar1[4].bindingStorage.bindingStatus;
  alloc = this_00->threadId;
  if (alloc < size) {
    QByteArray::resize((QByteArray *)this_00,(qsizetype)size);
    this_00 = pQVar1[4].bindingStorage.bindingStatus;
    alloc = size;
    if (this_00->threadId != size) {
      writeData();
      len = -1;
      goto LAB_00221427;
    }
  }
  if ((this_00->currentlyEvaluatingBinding == (BindingEvaluationState *)0x0) ||
     (1 < *(int *)&this_00->currentlyEvaluatingBinding->binding)) {
    QByteArray::reallocData((QByteArray *)this_00,(qsizetype)alloc,KeepSize);
  }
  pCVar2 = this_00->currentCompatProperty;
  iVar3 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])(this);
  memcpy((void *)((long)&pCVar2->property + CONCAT44(extraout_var_00,iVar3)),data,len);
  pQVar1[5].children.d.d =
       (Data *)((long)&((pQVar1[5].children.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + len);
  if (((*(int *)&pQVar1[5].children.d.ptr != 0) &&
      (*(char *)((long)&pQVar1[5].children.d.ptr + 4) == '\0')) &&
     ((((this->super_QIODevice).super_QObject.d_ptr.d)->field_0x30 & 2) == 0)) {
    *(undefined1 *)((long)&pQVar1[5].children.d.ptr + 4) = 1;
    local_58 = (void *)0x0;
    pcStack_50 = (char *)0x0;
    local_48[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"_q_emitSignals",QueuedConnection,1,&local_58,&pcStack_50,local_48);
  }
LAB_00221427:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return len;
}

Assistant:

qint64 QBuffer::writeData(const char *data, qint64 len)
{
    Q_D(QBuffer);
    const quint64 required = quint64(pos()) + quint64(len); // cannot overflow (pos() ≥ 0, len ≥ 0)

    if (required > quint64(d->buf->size())) { // capacity exceeded
        // The following must hold, since qsizetype covers half the virtual address space:
        Q_ASSERT(required <= quint64((std::numeric_limits<qsizetype>::max)()));
        d->buf->resize(qsizetype(required));
        if (quint64(d->buf->size()) != required) { // could not resize
            qWarning("QBuffer::writeData: Memory allocation error");
            return -1;
        }
    }

    memcpy(d->buf->data() + pos(), data, size_t(len));

#ifndef QT_NO_QOBJECT
    d->writtenSinceLastEmit += len;
    if (d->signalConnectionCount && !d->signalsEmitted && !signalsBlocked()) {
        d->signalsEmitted = true;
        QMetaObject::invokeMethod(this, "_q_emitSignals", Qt::QueuedConnection);
    }
#endif
    return len;
}